

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuArch.c
# Opt level: O2

BoolInt CPU_IsSupported_AVX2(void)

{
  long lVar1;
  BoolInt BVar2;
  UInt32 UVar3;
  uint uVar4;
  
  BVar2 = CPU_IsSupported_AVX();
  uVar4 = 0;
  if ((BVar2 != 0) && (UVar3 = z7_x86_cpuid_GetMaxFunc(), uVar4 = 0, 6 < UVar3)) {
    lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
    uVar4 = *(uint *)(lVar1 + 4) >> 5 & 1;
  }
  return uVar4;
}

Assistant:

BoolInt CPU_IsSupported_AVX2(void)
{
  if (!CPU_IsSupported_AVX())
    return False;
  if (z7_x86_cpuid_GetMaxFunc() < 7)
    return False;
  {
    UInt32 d[4];
    z7_x86_cpuid(d, 7);
    // printf("\ncpuid(7): ebx=%8x ecx=%8x\n", d[1], d[2]);
    return 1
      & (BoolInt)(d[1] >> 5); // avx2
  }
}